

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_test.cc
# Opt level: O0

void __thiscall
writer_test_should_write_repeating_groups_Test::writer_test_should_write_repeating_groups_Test
          (writer_test_should_write_repeating_groups_Test *this)

{
  writer_test_should_write_repeating_groups_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__writer_test_should_write_repeating_groups_Test_00361ac0;
  return;
}

Assistant:

TEST(writer_test, should_write_repeating_groups)
{
    Fixpp::v42::Message::Logon logon;
    Fixpp::set<Fixpp::Tag::EncryptMethod>(logon, 0);
    Fixpp::set<Fixpp::Tag::HeartBtInt>(logon, 60);

    auto group = Fixpp::createGroup<Fixpp::Tag::NoMsgTypes>(logon, 2);

    auto instance1 = group.instance();
    Fixpp::set<Fixpp::Tag::RefMsgType>(instance1, "TESTREF1");
    Fixpp::set<Fixpp::Tag::MsgDirection>(instance1, 'S');
    group.add(instance1);

    auto instance2 = group.instance();
    Fixpp::set<Fixpp::Tag::RefMsgType>(instance2, "TESTREF2");
    Fixpp::set<Fixpp::Tag::MsgDirection>(instance2, 'S');
    group.add(instance2);

    auto header = createHeader<Fixpp::v42::Header>();

    check(header, logon, { { 35, "A" }, { 98, "0" }, { 108, "60" }, { 384, "2" } });
}